

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-parser-test-suite.c
# Opt level: O1

void print_escaped(yaml_char_t *str,size_t length)

{
  yaml_char_t yVar1;
  size_t sVar2;
  char *__format;
  
  if (length != 0) {
    sVar2 = 0;
    do {
      yVar1 = str[sVar2];
      switch(yVar1) {
      case '\b':
        __format = "\\b";
        break;
      case '\t':
        __format = "\\t";
        break;
      case '\n':
        __format = "\\n";
        break;
      case '\v':
      case '\f':
switchD_0010262b_caseD_b:
        putchar((int)(char)yVar1);
        goto LAB_00102673;
      case '\r':
        __format = "\\r";
        break;
      default:
        if (yVar1 == '\0') {
          __format = "\\0";
        }
        else {
          if (yVar1 != '\\') goto switchD_0010262b_caseD_b;
          __format = "\\\\";
        }
      }
      printf(__format);
LAB_00102673:
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return;
}

Assistant:

void print_escaped(yaml_char_t * str, size_t length)
{
    int i;
    char c;

    for (i = 0; i < length; i++) {
        c = *(str + i);
        if (c == '\\')
            printf("\\\\");
        else if (c == '\0')
            printf("\\0");
        else if (c == '\b')
            printf("\\b");
        else if (c == '\n')
            printf("\\n");
        else if (c == '\r')
            printf("\\r");
        else if (c == '\t')
            printf("\\t");
        else
            printf("%c", c);
    }
}